

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

bool gl4cts::EnhancedLayouts::Utils::checkSSB
               (Program *program,Variable *variable,stringstream *stream)

{
  pointer pDVar1;
  Interface *pIVar2;
  Program *this;
  bool bVar3;
  GLuint index;
  ostream *poVar4;
  TestError *this_00;
  long lVar5;
  long lVar6;
  byte bVar7;
  ulong uVar8;
  GLint offset;
  string name_str;
  GLint local_cc;
  stringstream *local_c8;
  Interface *local_c0;
  string local_b8;
  string local_98;
  Variable *local_78;
  long local_70;
  ulong local_68;
  Program *local_60;
  string *local_58;
  string local_50;
  
  local_c8 = stream;
  bVar3 = Variable::IsBlock(variable);
  if (!bVar3) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Not implemented",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x4ca);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_c0 = (variable->m_descriptor).field_9.m_interface;
  lVar5 = (long)(local_c0->m_members).
                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_c0->m_members).
                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                ._M_impl.super__Vector_impl_data._M_start;
  bVar3 = lVar5 == 0;
  if (!bVar3) {
    lVar5 = lVar5 >> 4;
    local_68 = lVar5 * 0x6db6db6db6db6db7;
    local_58 = &local_c0->m_name;
    local_c8 = local_c8 + 0x10;
    lVar6 = 0;
    local_70 = lVar5 * -0x6db6db6db6db6db7 - (ulong)(local_68 == 0);
    bVar7 = 1;
    uVar8 = 1;
    local_78 = variable;
    local_60 = program;
    do {
      this = local_60;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,0x1b32ab9);
      pIVar2 = local_c0;
      local_cc = 0;
      Variable::GetReference
                (&local_b8,local_58,
                 (Descriptor *)
                 ((long)&((local_c0->m_members).
                          super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_expected_component + lVar6),
                 BASIC,0);
      if (*(int *)((long)&((pIVar2->m_members).
                           super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_type + lVar6) == 1) {
        Variable::GetReference
                  (&local_50,&local_b8,
                   (Descriptor *)
                   **(undefined8 **)
                     ((long)&((pIVar2->m_members).
                              super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_9 + lVar6),BASIC,0);
        std::__cxx11::string::_M_assign((string *)&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_98);
      }
      index = Program::GetResourceIndex(this,&local_98,0x92e5);
      Program::GetResource(this,0x92e5,index,0x92fc,1,&local_cc);
      pDVar1 = (local_c0->m_members).
               super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_cc != *(int *)((long)&pDVar1->m_offset + lVar6)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_c8,"Uniform: ",9);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_c8,
                            *(char **)((long)&(pDVar1->m_name)._M_dataplus + lVar6),
                            *(long *)((long)&(pDVar1->m_name)._M_string_length + lVar6));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," - invalid offset: ",0x13);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_cc);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," expected: ",0xb);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        bVar7 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      bVar3 = local_68 <= uVar8;
      lVar5 = local_70 + uVar8;
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + 0x70;
    } while (lVar5 != 0);
    bVar3 = (bool)(bVar3 & bVar7);
  }
  return bVar3;
}

Assistant:

bool checkSSB(Program& program, const Utils::Variable& variable, std::stringstream& stream)
{
	bool result = true;

	if (false == variable.IsBlock())
	{
		TCU_FAIL("Not implemented");
	}
	else
	{
		Utils::Interface* interface = variable.m_descriptor.m_interface;

		size_t size = interface->m_members.size();

		for (size_t i = 0; i < size; ++i)
		{
			GLuint		index	= 0;
			std::string name_str = "";
			GLint		offset   = 0;

			const std::string& name =
				Utils::Variable::GetReference(interface->m_name, interface->m_members[i], Utils::Variable::BASIC, 0);

			if (Utils::Variable::INTERFACE == interface->m_members[i].m_type)
			{
				const std::string& member_name = Utils::Variable::GetReference(
					name, interface->m_members[i].m_interface->m_members[0], Utils::Variable::BASIC, 0);

				name_str = member_name;
			}
			else
			{
				name_str = name;
			}

			try
			{
				index = program.GetResourceIndex(name_str, GL_BUFFER_VARIABLE);

				program.GetResource(GL_BUFFER_VARIABLE, index, GL_OFFSET, 1, &offset);
			}
			catch (std::exception& exc)
			{
				stream << "Failed to query program for buffer variable: " << variable.m_descriptor.m_name
					   << ". Reason: " << exc.what() << "\n";

				return false;
			}

			Utils::Variable::Descriptor& desc = interface->m_members[i];

			if (offset != (GLint)desc.m_offset)
			{
				stream << "Uniform: " << desc.m_name << " - invalid offset: " << offset
					   << " expected: " << desc.m_offset << std::endl;
				result = false;
			}
		}
	}

	return result;
}